

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O0

void __thiscall
OpticsParser::Parser::parseStringPropertyInsideBraces<std::__cxx11::string>
          (Parser *this,string *line,string *search,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *property)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  bool bVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __const_iterator local_70;
  size_type local_58;
  size_type erasePos;
  string str;
  size_type itr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *property_local;
  string *search_local;
  string *line_local;
  Parser *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (search,":");
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,search,0);
  if (sVar2 != 0xffffffffffffffff) {
    str.field_2._8_8_ = sVar2;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (search);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&erasePos,line,
               sVar2 + 1 + sVar3,0xffffffffffffffff);
    local_58 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &erasePos,'}',0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&erasePos,
               local_58,1);
    while( true ) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &erasePos);
      bVar5 = false;
      if (sVar2 != 0) {
        pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &erasePos);
        iVar1 = isspace((int)*pvVar4);
        bVar5 = iVar1 != 0;
      }
      if (!bVar5) break;
      local_78._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &erasePos);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_70,&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&erasePos,
                 local_70);
    }
    while( true ) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &erasePos);
      bVar5 = false;
      if (sVar2 != 0) {
        pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&erasePos
                     );
        iVar1 = isspace((int)*pvVar4);
        bVar5 = iVar1 != 0;
      }
      if (!bVar5) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&erasePos);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (property,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &erasePos);
    std::__cxx11::string::~string((string *)&erasePos);
  }
  return;
}

Assistant:

void parseStringPropertyInsideBraces(const std::string & line,
			std::string search,
			T & property)
		{
			search += ":";
			auto itr = line.find(search);
			if(itr != std::string::npos)
			{
				std::string str = line.substr(itr + search.size() + 1);
				auto erasePos = str.find('}');
				str.erase(erasePos, 1);
				// Removes all spaces from the beginning of the string
				while(str.size() && isspace(str.front()))
					str.erase(str.begin());
				// Remove all spaces from the end of the string.
				while(str.size() && isspace(str.back()))
					str.pop_back();
				property = str;
			}
		}